

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

GLFWcursor * glfwCreateStandardCursor(int shape)

{
  int iVar1;
  _GLFWcursor *handle;
  
  if (_glfw.initialized == 0) {
    handle = (_GLFWcursor *)0x0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (shape - 0x3600bU < 0xfffffff6) {
    handle = (_GLFWcursor *)0x0;
    _glfwInputError(0x10003,"Invalid standard cursor 0x%08X",(ulong)(uint)shape);
  }
  else {
    handle = (_GLFWcursor *)_glfw_calloc(1,0x10);
    handle->next = _glfw.cursorListHead;
    _glfw.cursorListHead = handle;
    iVar1 = (*_glfw.platform.createStandardCursor)(handle,shape);
    if (iVar1 == 0) {
      glfwDestroyCursor((GLFWcursor *)handle);
      handle = (_GLFWcursor *)0x0;
    }
  }
  return (GLFWcursor *)handle;
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateStandardCursor(int shape)
{
    _GLFWcursor* cursor;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (shape != GLFW_ARROW_CURSOR &&
        shape != GLFW_IBEAM_CURSOR &&
        shape != GLFW_CROSSHAIR_CURSOR &&
        shape != GLFW_POINTING_HAND_CURSOR &&
        shape != GLFW_RESIZE_EW_CURSOR &&
        shape != GLFW_RESIZE_NS_CURSOR &&
        shape != GLFW_RESIZE_NWSE_CURSOR &&
        shape != GLFW_RESIZE_NESW_CURSOR &&
        shape != GLFW_RESIZE_ALL_CURSOR &&
        shape != GLFW_NOT_ALLOWED_CURSOR)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid standard cursor 0x%08X", shape);
        return NULL;
    }

    cursor = _glfw_calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfw.platform.createStandardCursor(cursor, shape))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}